

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nordic_itch_handler.cc
# Opt level: O3

void __thiscall
helix::nasdaq::nordic_itch_handler::process_msg(nordic_itch_handler *this,itch_seconds *m)

{
  uint64_t uVar1;
  long lVar2;
  
  lVar2 = 1;
  uVar1 = 0;
  while (m->Second[lVar2 + -1] == ' ') {
    lVar2 = lVar2 + 1;
    if (lVar2 == 6) goto LAB_00116cfc;
  }
  uVar1 = 0;
  for (; lVar2 != 6; lVar2 = lVar2 + 1) {
    uVar1 = ((long)m->Second[lVar2 + -1] + uVar1 * 10) - 0x30;
  }
LAB_00116cfc:
  this->time_sec = uVar1;
  return;
}

Assistant:

void nordic_itch_handler::process_msg(const itch_seconds* m)
{
    auto second = itch_uatoi(m->Second, 5);
    time_sec = second;
}